

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_by_mmuidx_all_cpus_aarch64(CPUState *src_cpu,target_ulong addr,uint16_t idxmap)

{
  ulong addr_00;
  int iVar1;
  uc_struct_conflict2 *uc;
  uint16_t idxmap_local;
  target_ulong addr_local;
  CPUState *src_cpu_local;
  
  addr_00 = *(ulong *)&src_cpu->uc->init_target_page->mask & addr;
  iVar1 = (int)*(undefined8 *)&src_cpu->uc->init_target_page->mask;
  if (SBORROW4((uint)idxmap,-iVar1) != (int)((uint)idxmap + iVar1) < 0) {
    flush_all_helper(src_cpu,tlb_flush_page_by_mmuidx_async_1,(run_on_cpu_data)(addr_00 | idxmap));
  }
  tlb_flush_page_by_mmuidx_async_0(src_cpu,addr_00,idxmap);
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx_all_cpus(CPUState *src_cpu, target_ulong addr,
                                       uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = src_cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    /*
     * Allocate memory to hold addr+idxmap only when needed.
     * See tlb_flush_page_by_mmuidx for details.
     */
    if (idxmap < TARGET_PAGE_SIZE) {
        flush_all_helper(src_cpu, tlb_flush_page_by_mmuidx_async_1,
                         RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
#if 0
        CPUState *dst_cpu;

        /* Allocate a separate data block for each destination cpu.  */
        CPU_FOREACH(dst_cpu) {
            if (dst_cpu != src_cpu) {
                TLBFlushPageByMMUIdxData *d
                    = g_new(TLBFlushPageByMMUIdxData, 1);

                d->addr = addr;
                d->idxmap = idxmap;
                tlb_flush_page_by_mmuidx_async_2(dst_cpu, RUN_ON_CPU_HOST_PTR(d));
            }
        }
#endif
    }

    tlb_flush_page_by_mmuidx_async_0(src_cpu, addr, idxmap);
}